

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_enc.c
# Opt level: O0

int VP8EncDeleteAlpha(VP8Encoder *enc)

{
  WebPWorkerInterface *pWVar1;
  long in_RDI;
  WebPWorker *worker;
  int ok;
  int local_c;
  
  local_c = 1;
  if (0 < *(int *)(in_RDI + 0x5c50)) {
    pWVar1 = WebPGetWorkerInterface();
    local_c = (*pWVar1->Sync)((WebPWorker *)(in_RDI + 0x230));
    pWVar1 = WebPGetWorkerInterface();
    (*pWVar1->End)((WebPWorker *)(in_RDI + 0x230));
  }
  WebPSafeFree((void *)0x19ebf1);
  *(undefined8 *)(in_RDI + 0x220) = 0;
  *(undefined4 *)(in_RDI + 0x228) = 0;
  *(undefined4 *)(in_RDI + 0x21c) = 0;
  return local_c;
}

Assistant:

int VP8EncDeleteAlpha(VP8Encoder* const enc) {
  int ok = 1;
  if (enc->thread_level_ > 0) {
    WebPWorker* const worker = &enc->alpha_worker_;
    // finish anything left in flight
    ok = WebPGetWorkerInterface()->Sync(worker);
    // still need to end the worker, even if !ok
    WebPGetWorkerInterface()->End(worker);
  }
  WebPSafeFree(enc->alpha_data_);
  enc->alpha_data_ = NULL;
  enc->alpha_data_size_ = 0;
  enc->has_alpha_ = 0;
  return ok;
}